

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

DescriptorSetAllocation * __thiscall
Diligent::DescriptorSetAllocator::Allocate
          (DescriptorSetAllocation *__return_storage_ptr__,DescriptorSetAllocator *this,
          Uint64 CommandQueueMask,VkDescriptorSetLayout SetLayout,char *DebugName)

{
  mutex *__mutex;
  undefined1 *puVar1;
  VulkanLogicalDevice *LogicalDevice;
  VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14> *__b;
  DescriptorSetAllocation *pDVar2;
  VkDescriptorSet pVVar3;
  VkDescriptorPool pVVar4;
  _Elt_pointer pVVar5;
  _Elt_pointer __a;
  string _msg;
  _Map_pointer local_80;
  string local_68;
  deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
  *local_48;
  Uint64 local_40;
  DescriptorSetAllocation *local_38;
  
  __mutex = &(this->super_DescriptorPoolManager).m_Mutex;
  local_40 = CommandQueueMask;
  local_38 = __return_storage_ptr__;
  std::mutex::lock(__mutex);
  __a = (this->super_DescriptorPoolManager).m_Pools.
        super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  LogicalDevice =
       (((this->super_DescriptorPoolManager).m_DeviceVkImpl)->m_LogicalVkDevice).
       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48 = (deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
              *)&(this->super_DescriptorPoolManager).m_Pools;
  pVVar5 = (this->super_DescriptorPoolManager).m_Pools.
           super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_80 = (this->super_DescriptorPoolManager).m_Pools.
             super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  do {
    if (__a == (this->super_DescriptorPoolManager).m_Pools.
               super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      FormatString<char[30]>(&local_68,(char (*) [30])"Allocated new descriptor pool");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(0,local_68._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&local_68);
      DescriptorPoolManager::CreateDescriptorPool
                ((DescriptorPoolWrapper *)&local_68,&this->super_DescriptorPoolManager,
                 "Descriptor pool");
      std::
      deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
      ::
      emplace_front<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>
                (local_48,(VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>
                           *)&local_68);
      VulkanUtilities::
      VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
      ~VulkanObjectWrapper
                ((VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>
                  *)&local_68);
      pVVar5 = (this->super_DescriptorPoolManager).m_Pools.
               super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pVVar3 = AllocateDescriptorSet(LogicalDevice,pVVar5->m_VkObject,SetLayout,DebugName);
      if (pVVar3 == (VkDescriptorSet)0x0) {
        FormatString<char[34]>(&local_68,(char (*) [34])"Failed to allocate descriptor set");
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
                   ,0xe7);
        std::__cxx11::string::~string((string *)&local_68);
      }
      LOCK();
      puVar1 = &(this->super_DescriptorPoolManager).field_0xc4;
      *(int *)puVar1 = *(int *)puVar1 + 1;
      UNLOCK();
      pVVar4 = pVVar5->m_VkObject;
LAB_001b3365:
      pDVar2 = local_38;
      local_38->Set = pVVar3;
      local_38->Pool = pVVar4;
      local_38->CmdQueueMask = local_40;
      local_38->DescrSetAllocator = this;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return pDVar2;
    }
    pVVar3 = AllocateDescriptorSet(LogicalDevice,__a->m_VkObject,SetLayout,DebugName);
    if (pVVar3 != (VkDescriptorSet)0x0) {
      pVVar4 = __a->m_VkObject;
      __b = (this->super_DescriptorPoolManager).m_Pools.
            super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (__a != __b) {
        std::
        swap<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>
                  (__a,__b);
      }
      LOCK();
      puVar1 = &(this->super_DescriptorPoolManager).field_0xc4;
      *(int *)puVar1 = *(int *)puVar1 + 1;
      UNLOCK();
      goto LAB_001b3365;
    }
    __a = __a + 1;
    if (__a == pVVar5) {
      __a = local_80[1];
      local_80 = local_80 + 1;
      pVVar5 = __a + 0x15;
    }
  } while( true );
}

Assistant:

DescriptorSetAllocation DescriptorSetAllocator::Allocate(Uint64 CommandQueueMask, VkDescriptorSetLayout SetLayout, const char* DebugName)
{
    // Descriptor pools are externally synchronized, meaning that the application must not allocate
    // and/or free descriptor sets from the same pool in multiple threads simultaneously (13.2.3)
    std::lock_guard<std::mutex> Lock{m_Mutex};

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_DeviceVkImpl.GetLogicalDevice();
    // Try all pools starting from the frontmost
    for (auto it = m_Pools.begin(); it != m_Pools.end(); ++it)
    {
        VkDescriptorSet vkSet = AllocateDescriptorSet(LogicalDevice, *it, SetLayout, DebugName);
        if (vkSet != VK_NULL_HANDLE)
        {
            VkDescriptorPool vkPool = *it;
            // Move the pool to the front
            if (it != m_Pools.begin())
            {
                std::swap(*it, m_Pools.front());
            }

#ifdef DILIGENT_DEVELOPMENT
            ++m_AllocatedSetCounter;
#endif
            return {vkSet, vkPool, CommandQueueMask, *this};
        }
    }

    // Failed to allocate descriptor from existing pools -> create a new one
    LOG_INFO_MESSAGE("Allocated new descriptor pool");
    m_Pools.emplace_front(CreateDescriptorPool("Descriptor pool"));

    VulkanUtilities::DescriptorPoolWrapper& NewPool = m_Pools.front();
    VkDescriptorSet                         vkSet   = AllocateDescriptorSet(LogicalDevice, NewPool, SetLayout, DebugName);
    DEV_CHECK_ERR(vkSet != VK_NULL_HANDLE, "Failed to allocate descriptor set");

#ifdef DILIGENT_DEVELOPMENT
    ++m_AllocatedSetCounter;
#endif

    return {vkSet, NewPool, CommandQueueMask, *this};
}